

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O2

void __thiscall result_tests::check_returned::test_method(check_returned *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bilingual_str s;
  bilingual_str s_00;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffdc8;
  string in_stack_fffffffffffffde8;
  bilingual_str local_1f0;
  string local_1b0 [32];
  _Variadic_union<int> local_190 [16];
  string local_150 [32];
  bilingual_str local_130;
  string local_f0 [32];
  string local_d0 [32];
  bilingual_str local_b0;
  _Variadic_union<bilingual_str,_bilingual_str> local_70;
  undefined1 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_b0.original.field_2;
  local_b0.original._M_string_length = 0;
  local_190[0] = (_Variadic_union<int>)0x5;
  local_b0.original.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_b0.translated.field_2;
  local_b0.translated._M_string_length = 0;
  local_30 = 1;
  local_b0.translated.field_2._M_local_buf[0] = '\0';
  local_b0.original._M_dataplus._M_p = (pointer)paVar1;
  local_b0.translated._M_dataplus._M_p = (pointer)paVar2;
  local_70._0_4_ = local_190[0];
  ExpectSuccess<int,int>((Result<int> *)&local_70._M_first,&local_b0,(int *)local_190);
  bilingual_str::~bilingual_str(&local_b0);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_int> *)&local_70._M_first);
  IntFn((Result<int> *)&local_70._M_first,5,false);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"int 5 error.",(allocator<char> *)&local_190[0]._M_first);
  Untranslated(&local_b0,in_stack_fffffffffffffdc8);
  ExpectFail<int>((Result<int> *)&local_70._M_first,&local_b0);
  bilingual_str::~bilingual_str(&local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_int>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_int> *)&local_70._M_first);
  NoCopyFn((Result<result_tests::NoCopy> *)&local_70._M_first,5,true);
  local_b0.original._M_string_length = 0;
  local_b0.original.field_2._M_local_buf[0] = '\0';
  local_b0.translated._M_string_length = 0;
  local_b0.translated.field_2._M_local_buf[0] = '\0';
  local_190[0] = (_Variadic_union<int>)0x5;
  local_b0.original._M_dataplus._M_p = (pointer)paVar1;
  local_b0.translated._M_dataplus._M_p = (pointer)paVar2;
  ExpectSuccess<result_tests::NoCopy,int>
            ((Result<result_tests::NoCopy> *)&local_70._M_first,&local_b0,(int *)local_190);
  bilingual_str::~bilingual_str(&local_b0);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_result_tests::NoCopy>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_result_tests::NoCopy> *)
                    &local_70._M_first);
  NoCopyFn((Result<result_tests::NoCopy> *)&local_70._M_first,5,false);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"nocopy 5 error.",(allocator<char> *)&local_190[0]._M_first);
  Untranslated(&local_b0,in_stack_fffffffffffffdc8);
  ExpectFail<result_tests::NoCopy>((Result<result_tests::NoCopy> *)&local_70._M_first,&local_b0);
  bilingual_str::~bilingual_str(&local_b0);
  std::__cxx11::string::~string(local_f0);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_result_tests::NoCopy>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_result_tests::NoCopy> *)
                    &local_70._M_first);
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"S",(allocator<char> *)&stack0xfffffffffffffdcf);
  Untranslated(&local_130,in_stack_fffffffffffffdc8);
  s.translated = in_stack_fffffffffffffde8;
  s.original = in_stack_fffffffffffffdc8;
  StrFn((Result<bilingual_str> *)&local_70._M_first,s,SUB81(&local_130,0));
  local_b0.original._M_string_length = 0;
  local_b0.original.field_2._M_local_buf[0] = '\0';
  local_b0.translated._M_string_length = 0;
  local_b0.translated.field_2._M_local_buf[0] = '\0';
  local_b0.original._M_dataplus._M_p = (pointer)paVar1;
  local_b0.translated._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b0,"S",(allocator<char> *)&stack0xfffffffffffffdce);
  Untranslated((bilingual_str *)&local_190[0]._M_first,in_stack_fffffffffffffdc8);
  ExpectSuccess<bilingual_str,bilingual_str>
            ((Result<bilingual_str> *)&local_70._M_first,&local_b0,
             (bilingual_str *)&local_190[0]._M_first);
  bilingual_str::~bilingual_str((bilingual_str *)&local_190[0]._M_first);
  std::__cxx11::string::~string(local_1b0);
  bilingual_str::~bilingual_str(&local_b0);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_bilingual_str>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_bilingual_str> *)&local_70._M_first);
  bilingual_str::~bilingual_str(&local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffdf0,"S",(allocator<char> *)&local_190[0]._M_first);
  Untranslated(&local_1f0,in_stack_fffffffffffffdc8);
  s_00.translated = in_stack_fffffffffffffde8;
  s_00.original = in_stack_fffffffffffffdc8;
  StrFn((Result<bilingual_str> *)&local_70._M_first,s_00,SUB81(&local_1f0,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffdd0,"str S error.",
             (allocator<char> *)&stack0xfffffffffffffdcf);
  Untranslated(&local_b0,in_stack_fffffffffffffdc8);
  ExpectFail<bilingual_str>((Result<bilingual_str> *)&local_70._M_first,&local_b0);
  bilingual_str::~bilingual_str(&local_b0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_bilingual_str>::~_Variant_storage
            ((_Variant_storage<false,_bilingual_str,_bilingual_str> *)&local_70._M_first);
  bilingual_str::~bilingual_str(&local_1f0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_returned)
{
    ExpectSuccess(IntFn(5, true), {}, 5);
    ExpectFail(IntFn(5, false), Untranslated("int 5 error."));
    ExpectSuccess(NoCopyFn(5, true), {}, 5);
    ExpectFail(NoCopyFn(5, false), Untranslated("nocopy 5 error."));
    ExpectSuccess(StrFn(Untranslated("S"), true), {}, Untranslated("S"));
    ExpectFail(StrFn(Untranslated("S"), false), Untranslated("str S error."));
}